

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O1

int Mvc_CoverAnyLiteral(Mvc_Cover_t *pCover,Mvc_Cube_t *pMask)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Mvc_Cube_t *pMVar5;
  
  uVar3 = pCover->nBits;
  if (0 < pCover->nBits) {
    do {
      uVar4 = uVar3 - 1;
      if (((pMask == (Mvc_Cube_t *)0x0) || ((pMask->pData[uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0))
         && (pMVar5 = (pCover->lCubes).pHead, pMVar5 != (Mvc_Cube_t *)0x0)) {
        bVar1 = false;
        do {
          bVar2 = bVar1;
          if ((pMVar5->pData[uVar4 >> 5] & 1 << ((byte)uVar4 & 0x1f)) != 0) {
            bVar2 = true;
            if (bVar1) {
              return uVar4;
            }
          }
          bVar1 = bVar2;
          pMVar5 = pMVar5->pNext;
        } while (pMVar5 != (Mvc_Cube_t *)0x0);
      }
      bVar1 = 1 < (int)uVar3;
      uVar3 = uVar4;
    } while (bVar1);
  }
  return -1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the any literal that occurs more than once.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Mvc_CoverAnyLiteral( Mvc_Cover_t * pCover, Mvc_Cube_t * pMask )
{
    Mvc_Cube_t * pCube;
    int nWord, nBit, i;
    int nLitsCur;
    int fUseFirst = 0;

    // go through each literal
    if ( fUseFirst )
    {
        for ( i = 0; i < pCover->nBits; i++ )
            if ( !pMask || Mvc_CubeBitValue(pMask,i) )
            {
                // get the word and bit of this literal
                nWord = Mvc_CubeWhichWord(i);
                nBit  = Mvc_CubeWhichBit(i);
                // go through all the cubes
                nLitsCur = 0;
                Mvc_CoverForEachCube( pCover, pCube )
                    if ( pCube->pData[nWord] & (1<<nBit) )
                    {
                        nLitsCur++;
                        if ( nLitsCur > 1 )
                            return i;
                    }
            }
    }
    else
    {
        for ( i = pCover->nBits - 1; i >=0; i-- )
            if ( !pMask || Mvc_CubeBitValue(pMask,i) )
            {
                // get the word and bit of this literal
                nWord = Mvc_CubeWhichWord(i);
                nBit  = Mvc_CubeWhichBit(i);
                // go through all the cubes
                nLitsCur = 0;
                Mvc_CoverForEachCube( pCover, pCube )
                    if ( pCube->pData[nWord] & (1<<nBit) )
                    {
                        nLitsCur++;
                        if ( nLitsCur > 1 )
                            return i;
                    }
            }
    }
    return -1;
}